

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_keyt.c
# Opt level: O0

err_t bignKeyWrap(octet *token,bign_params *params,octet *key,size_t len,octet *header,octet *pubkey
                 ,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  word *n_00;
  gen_i rng_state_00;
  gen_i key_00;
  code *buf;
  ec_o *in_RCX;
  word *in_RDX;
  word *in_RSI;
  void *in_RDI;
  word *in_R8;
  bign_deep_i in_R9;
  octet *stack;
  octet *theta;
  word *R;
  word *k;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  undefined7 in_stack_ffffffffffffff78;
  octet in_stack_ffffffffffffff7f;
  bign_params *in_stack_ffffffffffffff80;
  word *mod;
  bign_params *in_stack_ffffffffffffffb0;
  word *a;
  void *in_stack_ffffffffffffffb8;
  long lVar4;
  undefined4 in_stack_ffffffffffffffc0;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = bignIsOperable(in_stack_ffffffffffffff80);
  if (bVar1 == 0) {
    return 0x1f6;
  }
  if (stack == (octet *)0x0) {
    return 0x130;
  }
  if (((in_RCX < (ec_o *)0x10) || (bVar1 = memIsValid(in_RDX,(size_t)in_RCX), bVar1 == 0)) ||
     ((in_R8 != (word *)0x0 && (bVar1 = memIsValid(in_R8,0x10), bVar1 == 0)))) {
    return 0x6d;
  }
  bignStart_keep((size_t)in_R8,in_R9);
  n_00 = (word *)blobCreate(CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (n_00 == (word *)0x0) {
    return 0x6e;
  }
  eVar2 = bignStart(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (eVar2 != 0) {
    blobClose((blob_t)0x15f0f8);
    return eVar2;
  }
  lVar4 = *(long *)(n_00[3] + 0x38);
  a = *(word **)(n_00[3] + 0x30);
  mod = n_00;
  bVar1 = memIsValid(in_R9,lVar4 << 1);
  if ((bVar1 == 0) || (bVar1 = memIsValid(in_RDI,(long)&(in_RCX->hdr).o_count + lVar4), bVar1 == 0))
  {
    blobClose((blob_t)0x15f174);
    return 0x6d;
  }
  rng_state_00 = (gen_i)((long)n_00 + *n_00) + (long)a * 8;
  key_00 = rng_state_00 + (long)a * 0x10;
  buf = key_00 + 0x20;
  bVar1 = zzRandNZMod(a,mod,(size_t)n_00,(gen_i)((long)n_00 + *n_00),rng_state_00);
  if (bVar1 == 0) {
    blobClose((blob_t)0x15f20a);
    return 0x130;
  }
  iVar3 = (**(code **)(n_00[3] + 0x40))(rng_state_00,in_R9,n_00[3],buf);
  if ((iVar3 != 0) &&
     (iVar3 = (**(code **)(n_00[3] + 0x40))(rng_state_00 + (long)a * 8,in_R9 + lVar4,n_00[3],buf),
     iVar3 != 0)) {
    bVar1 = ecMulA(in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,
                   (void *)CONCAT44(eVar2,in_stack_ffffffffffffffc0));
    if (bVar1 == 0) {
      blobClose((blob_t)0x15f2cf);
      return 0x1f6;
    }
    (**(code **)(n_00[3] + 0x48))(key_00,rng_state_00,n_00[3],buf);
    bVar1 = ecMulA(in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,
                   (void *)CONCAT44(eVar2,in_stack_ffffffffffffffc0));
    if (bVar1 == 0) {
      blobClose((blob_t)0x15f33c);
      return 0x1f6;
    }
    (**(code **)(n_00[3] + 0x48))(rng_state_00,rng_state_00,n_00[3],buf);
    if (in_R8 == (word *)0x0) {
      memSet(buf,in_stack_ffffffffffffff7f,0x15f3ba);
    }
    else {
      memCopy(buf,(void *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0x15f39b);
    }
    memMove(buf,(void *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0x15f3d3);
    memCopy(buf,(void *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0x15f3fd);
    beltWBLStart(rng_state_00,(octet *)key_00,(size_t)buf);
    beltWBLStepE(rng_state_00,(size_t)key_00,buf);
    memCopy(buf,(void *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0x15f442);
    blobClose((blob_t)0x15f44c);
    return 0;
  }
  blobClose((blob_t)0x15f28d);
  return 0x1f9;
}

Assistant:

err_t bignKeyWrap(octet token[], const bign_params* params, const octet key[],
	size_t len, const octet header[16], const octet pubkey[],
	gen_i rng, void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	octet* theta;			/* [32] ключ защиты */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// проверить header и key
	if (len < 16 ||
		!memIsValid(key, len) ||
		!memIsNullOrValid(header, 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeyWrap_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 2 * no) ||
		!memIsValid(token, 16 + no + len))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	k = objEnd(ec, word);
	R = k + n;
	theta = (octet*)(R + 2 * n);
	stack = theta + 32;
	// сгенерировать k
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// R <- k Q
	if (!qrFrom(ecX(R), pubkey, ec->f, stack) ||
		!qrFrom(ecY(R, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	if (!ecMulA(R, R, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// theta <- <R>_{256}
	qrTo(theta, ecX(R), ec->f, stack);
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// сформировать блок для шифрования
	// (буферы key, header и token могут пересекаться)
	if (header)
		memCopy(R + n, header, 16);
	else
		memSetZero(R + n, 16);
	memMove(token + no, key, len);
	memCopy(token + no + len, R + n, 16);
	// зашифровать
	beltKWPStart(stack, theta, 32);
	beltKWPStepE(token + no, len + 16, stack);
	// доопределить токен
	memCopy(token, R, no);
	// все нормально
	blobClose(state);
	return ERR_OK;
}